

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O0

void Curl_doh_close(Curl_easy *data)

{
  long mid_00;
  Curl_easy *local_38;
  ulong local_30;
  size_t slot;
  curl_off_t mid;
  Curl_easy *probe_data;
  doh_probes *doh;
  Curl_easy *data_local;
  
  probe_data = (Curl_easy *)(data->req).doh;
  if ((probe_data != (Curl_easy *)0x0) && (data->multi != (Curl_multi *)0x0)) {
    doh = (doh_probes *)data;
    for (local_30 = 0; local_30 < 2; local_30 = local_30 + 1) {
      mid_00 = (&probe_data->id)[local_30 * 0x47];
      if (-1 < mid_00) {
        (&probe_data->id)[local_30 * 0x47] = -1;
        if (*(long *)(doh->probe[0].req_body + 0x8c) == 0) {
          local_38 = (Curl_easy *)0x0;
        }
        else {
          local_38 = Curl_multi_get_handle(*(Curl_multi **)(doh->probe[0].req_body + 0x8c),mid_00);
        }
        mid = (curl_off_t)local_38;
        if (local_38 != (Curl_easy *)0x0) {
          curl_multi_remove_handle(*(CURLM **)(doh->probe[0].req_body + 0x8c),local_38);
          Curl_close((Curl_easy **)&mid);
        }
      }
    }
  }
  return;
}

Assistant:

void Curl_doh_close(struct Curl_easy *data)
{
  struct doh_probes *doh = data->req.doh;
  if(doh && data->multi) {
    struct Curl_easy *probe_data;
    curl_off_t mid;
    size_t slot;
    for(slot = 0; slot < DOH_SLOT_COUNT; slot++) {
      mid = doh->probe[slot].easy_mid;
      if(mid < 0)
        continue;
      doh->probe[slot].easy_mid = -1;
      /* should have been called before data is removed from multi handle */
      DEBUGASSERT(data->multi);
      probe_data = data->multi ? Curl_multi_get_handle(data->multi, mid) :
        NULL;
      if(!probe_data) {
        DEBUGF(infof(data, "Curl_doh_close: xfer for mid=%"
                     FMT_OFF_T " not found!",
                     doh->probe[slot].easy_mid));
        continue;
      }
      /* data->multi might already be reset at this time */
      curl_multi_remove_handle(data->multi, probe_data);
      Curl_close(&probe_data);
    }
  }
}